

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-iosim.c
# Opt level: O1

int main(int argc,char **argv)

{
  char acVar1 [8];
  ptrdiff_t pVar2;
  int iVar3;
  int iVar4;
  void *buf;
  FILE *__stream;
  int *piVar5;
  ulong uVar6;
  void *pvVar7;
  char *pcVar8;
  ulong uVar9;
  void *pvVar10;
  size_t bytes;
  ulong uVar11;
  void *pvVar12;
  long lVar13;
  undefined8 *puVar14;
  char **ppcVar15;
  long lVar16;
  double dVar17;
  char local_18f8 [8];
  char buffer [1500];
  char local_8f8 [1504];
  undefined1 local_318 [8];
  BigArray array;
  undefined1 auStack_e8 [8];
  BigBlock bb;
  BigBlockPtr ptr;
  char **argv_local;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  int local_44;
  BigFile BStack_40;
  int argc_local;
  BigFile bf;
  
  ptr.aoffset = (ptrdiff_t)argv;
  local_44 = argc;
  MPI_Init(&local_44,&ptr.aoffset);
  MPI_Comm_rank(&ompi_mpi_comm_world,&ThisTask);
  MPI_Comm_size(&ompi_mpi_comm_world,&NTask);
LAB_001036e0:
  do {
    iVar3 = getopt(local_44,(char **)ptr.aoffset,getoptstr);
    pVar2 = ptr.aoffset;
    iVar4 = _optind;
    if (iVar3 < 0x6e) {
      piVar5 = &aggregated;
      if (iVar3 == 0x41) goto LAB_00103771;
      if (iVar3 != 0x66) {
        if ((iVar3 == -1) && (lVar16 = (long)_optind, _optind != local_44)) {
          pcVar8 = strdup(*(char **)(ptr.aoffset + lVar16 * 8));
          mode = 0;
          ppcVar15 = MODES;
          lVar13 = 0;
          goto LAB_001037b5;
        }
        break;
      }
      pcVar8 = "%d";
      piVar5 = &Nfile;
    }
    else {
      switch(iVar3) {
      case 0x6e:
        pcVar8 = "%d";
        piVar5 = &Nwriter;
        break;
      default:
        goto switchD_0010370b_caseD_6f;
      case 0x70:
        piVar5 = &purge;
LAB_00103771:
        *piVar5 = 1;
        goto LAB_001036e0;
      case 0x73:
        pcVar8 = "%td";
        piVar5 = (int *)&size;
        break;
      case 0x77:
        pcVar8 = "%d";
        piVar5 = &nmemb;
      }
    }
    iVar4 = __isoc99_sscanf(_optarg,pcVar8,piVar5);
  } while (iVar4 == 1);
  goto switchD_0010370b_caseD_6f;
  while( true ) {
    lVar13 = lVar13 + 1;
    mode = (int)lVar13;
    ppcVar15 = ppcVar15 + 1;
    if (lVar13 == 4) break;
LAB_001037b5:
    iVar3 = strcmp(*ppcVar15,pcVar8);
    if (iVar3 == 0) goto LAB_001037de;
  }
  lVar13 = 4;
LAB_001037de:
  if ((int)lVar13 != 4) {
    _optind = iVar4 + 1;
    strcpy(local_8f8,*(char **)(pVar2 + 8 + lVar16 * 8));
    if (Nwriter == 0 || NTask < Nwriter) {
      info("############## CAUTION: you chose %d ranks and %d writers! ##############\n #  If you want %d writers, allocate at least %d ranks with <mpirun -n %d> #\n ################### Can only use %d writers instead! ###################\n"
           ,(ulong)(uint)NTask,(ulong)(uint)Nwriter,(ulong)(uint)Nwriter,(ulong)(uint)Nwriter,
           (ulong)(uint)Nwriter,(ulong)(uint)NTask);
      Nwriter = NTask;
    }
    if (Nfile == 0) {
      Nfile = Nwriter;
    }
    if (aggregated == 0) {
      bytes = 0;
    }
    else {
      bytes = (long)nmemb * size * 8;
    }
    big_file_mpi_set_aggregated_threshold(bytes);
    BStack_40.basename = (char *)0x0;
    bb.Nfile = 0;
    bb._60_4_ = 0;
    bb.attrset = (BigAttrSet *)0x0;
    bb.foffset = (size_t *)0x0;
    bb.fchecksum = (uint *)0x0;
    bb.size = 0;
    bb.fsize = (size_t *)0x0;
    bb.nmemb = 0;
    bb._12_4_ = 0;
    bb.basename = (char *)0x0;
    auStack_e8[0] = '\0';
    auStack_e8[1] = '\0';
    auStack_e8[2] = '\0';
    auStack_e8[3] = '\0';
    auStack_e8[4] = '\0';
    auStack_e8[5] = '\0';
    auStack_e8[6] = '\0';
    auStack_e8[7] = '\0';
    bb.dtype[0] = '\0';
    bb.dtype[1] = '\0';
    bb.dtype[2] = '\0';
    bb.dtype[3] = '\0';
    bb.dtype[4] = '\0';
    bb.dtype[5] = '\0';
    bb.dtype[6] = '\0';
    bb.dtype[7] = '\0';
    memset(local_318,0,0x220);
    ptr.roffset = 0;
    bb.dirty = 0;
    bb._76_4_ = 0;
    ptr.fileid = 0;
    ptr._4_4_ = 0;
    info("iosim.c: started.\n");
    big_file_mpi_set_verbose(1);
    local_58 = 0.0;
    local_68 = 0.0;
    dStack_60 = 0.0;
    argv_local = (char **)0x0;
    dStack_70 = 0.0;
    if (mode - 1U < 2) {
      info("Opening BigFile\n");
      bf.basename = (char *)MPI_Wtime();
      iVar4 = big_file_mpi_open(&stack0xffffffffffffffc0,local_8f8,(MPI_Comm)&ompi_mpi_comm_world);
      if (iVar4 == 0) {
        dVar17 = (double)MPI_Wtime();
        dStack_70 = (dVar17 - (double)bf.basename) + dStack_70;
        pcVar8 = (char *)0x0;
        info("Opened BigFile\n");
        info("Opening BigBlock\n");
        bf.basename = (char *)MPI_Wtime();
        big_file_mpi_open_block
                  (&stack0xffffffffffffffc0,(BigBlock *)auStack_e8,"TestBlock",
                   (MPI_Comm)&ompi_mpi_comm_world);
        dVar17 = (double)MPI_Wtime();
        dStack_70 = (dVar17 - (double)bf.basename) + dStack_70;
        info("Opened BigBlock\n");
        acVar1 = bb.dtype;
        size = (size_t)bb.basename;
        nmemb._0_1_ = bb.dtype[0];
        nmemb._1_1_ = bb.dtype[1];
        nmemb._2_1_ = bb.dtype[2];
        nmemb._3_1_ = bb.dtype[3];
        Nfile = (int)bb.fchecksum;
        bb.dtype = acVar1;
        goto LAB_00103bd4;
      }
LAB_00103b1d:
      pcVar8 = big_file_get_error_message();
      puts(pcVar8);
    }
    else {
      if (mode == 3) {
        info("Growing BigFile\n");
        bf.basename = (char *)MPI_Wtime();
        iVar4 = big_file_mpi_open(&stack0xffffffffffffffc0,local_8f8,(MPI_Comm)&ompi_mpi_comm_world)
        ;
        if (iVar4 != 0) goto LAB_00103b1d;
        dVar17 = (double)MPI_Wtime();
        dStack_70 = (dVar17 - (double)bf.basename) + dStack_70;
        info("Opened BigFile\n");
        info("Opening BigBlock\n");
        bf.basename = (char *)MPI_Wtime();
        big_file_mpi_open_block
                  (&stack0xffffffffffffffc0,(BigBlock *)auStack_e8,"TestBlock",
                   (MPI_Comm)&ompi_mpi_comm_world);
        pcVar8 = bb.basename;
        big_block_mpi_grow_simple((BigBlock *)auStack_e8,Nfile,size,(MPI_Comm)&ompi_mpi_comm_world);
        dVar17 = (double)MPI_Wtime();
        dStack_70 = (dVar17 - (double)bf.basename) + dStack_70;
        info("Opened BigBlock\n");
        acVar1 = bb.dtype;
        nmemb._0_1_ = bb.dtype[0];
        nmemb._1_1_ = bb.dtype[1];
        nmemb._2_1_ = bb.dtype[2];
        nmemb._3_1_ = bb.dtype[3];
        bb.dtype = acVar1;
      }
      else {
        if (mode != 0) {
LAB_001041ca:
          abort();
        }
        pcVar8 = (char *)0x0;
        info("Creating BigFile\n");
        bf.basename = (char *)MPI_Wtime();
        big_file_mpi_create(&stack0xffffffffffffffc0,local_8f8,(MPI_Comm)&ompi_mpi_comm_world);
        dVar17 = (double)MPI_Wtime();
        argv_local = (char **)((dVar17 - (double)bf.basename) + (double)argv_local);
        info("Created BigFile\n");
        info("Creating BigBlock\n");
        bf.basename = (char *)MPI_Wtime();
        big_file_mpi_create_block
                  (&stack0xffffffffffffffc0,(BigBlock *)auStack_e8,"TestBlock","i8",nmemb,Nfile,size
                   ,(MPI_Comm)&ompi_mpi_comm_world);
        dVar17 = (double)MPI_Wtime();
        argv_local = (char **)((dVar17 - (double)bf.basename) + (double)argv_local);
        info("Created BigBlock\n");
      }
LAB_00103bd4:
      big_block_seek((BigBlock *)auStack_e8,(BigBlockPtr *)&bb.dirty,(ptrdiff_t)pcVar8);
      uVar9 = (ulong)ThisTask;
      if ((uVar9 & 1) == 0) {
        uVar11 = (ulong)NTask;
        uVar9 = (uVar9 * size) / uVar11;
        iVar4 = ThisTask + 2;
        if (NTask <= ThisTask + 2) {
          iVar4 = NTask;
        }
        uVar6 = ((long)iVar4 * size) % uVar11;
        pvVar12 = (void *)(((long)iVar4 * size) / uVar11 - uVar9);
      }
      else {
        uVar6 = size * (uVar9 - 1);
        pvVar12 = (void *)0x0;
        uVar9 = uVar6 / (ulong)(long)NTask;
        uVar6 = uVar6 % (ulong)(long)NTask;
      }
      info("Writing to `%s`\n",local_8f8,uVar6);
      info("mode %s\n",MODES[mode]);
      info("nmemb %d\n",(ulong)(uint)nmemb);
      info("Size %td\n",size);
      info("NBlobFiles %td\n",(ulong)(uint)Nfile);
      info("BytesPerBlob %td\n",(ulong)(uint)Nfile);
      info("Ranks %d\n",(ulong)(uint)NTask);
      info("Writers %d\n",(ulong)(uint)Nwriter);
      info("Aggregated %d\n",(ulong)(uint)aggregated);
      info("LocalBytes %td\n",(long)nmemb * (long)pvVar12 * 8);
      info("LocalSize %td\n",pvVar12);
      buf = malloc((long)pvVar12 * 8 * (long)nmemb);
      array.data = pvVar12;
      big_array_init((BigArray *)local_318,buf,"i8",2,(size_t *)&array.data,(ptrdiff_t *)0x0);
      if (mode - 2U < 2) {
LAB_00103da0:
        info("Initializing FakeData\n");
        iVar4 = nmemb;
        if (pvVar12 != (void *)0x0) {
          uVar6 = (ulong)(uint)nmemb;
          lVar16 = (long)nmemb;
          pvVar7 = (void *)0x0;
          pvVar10 = buf;
          do {
            if (0 < iVar4) {
              uVar11 = 0;
              do {
                *(ulong *)((long)pvVar10 + uVar11 * 8) = (long)pvVar7 + uVar9;
                uVar11 = uVar11 + 1;
              } while (uVar6 != uVar11);
            }
            pvVar7 = (void *)((long)pvVar7 + 1);
            pvVar10 = (void *)((long)pvVar10 + lVar16 * 8);
          } while (pvVar7 != pvVar12);
        }
        info("Initialized FakeData\n");
        info("Writing BigBlock\n");
        bf.basename = (char *)MPI_Wtime();
        iVar4 = big_block_mpi_write((BigBlock *)auStack_e8,(BigBlockPtr *)&bb.dirty,
                                    (BigArray *)local_318,Nwriter,(MPI_Comm)&ompi_mpi_comm_world);
        if (iVar4 != 0) {
          pcVar8 = big_file_get_error_message();
          info("Error occured: %s\n",pcVar8);
        }
        dVar17 = (double)MPI_Wtime();
        local_68 = (dVar17 - (double)bf.basename) + local_68;
        info("Written BigBlock\n");
        info("Writing took %f seconds\n",local_68);
      }
      else if (mode == 1) {
        info("Reading BigBlock\n");
        bf.basename = (char *)MPI_Wtime();
        iVar4 = big_block_mpi_read((BigBlock *)auStack_e8,(BigBlockPtr *)&bb.dirty,
                                   (BigArray *)local_318,Nwriter,(MPI_Comm)&ompi_mpi_comm_world);
        if (iVar4 != 0) {
          pcVar8 = big_file_get_error_message();
          info("Error occured: %s\n",pcVar8);
        }
        dVar17 = (double)MPI_Wtime();
        dStack_60 = (dVar17 - (double)bf.basename) + dStack_60;
        info("Reading took %f seconds\n");
        info("Initializing FakeData\n");
        if (pvVar12 != (void *)0x0) {
          pvVar7 = (void *)0x0;
          pvVar10 = buf;
          do {
            if (0 < nmemb) {
              uVar6 = 0;
              do {
                if (*(long *)((long)pvVar10 + uVar6 * 8) != (long)pvVar7 + uVar9) {
                  info("data is corrupted either due to reading or writing\n");
                  goto LAB_001041ca;
                }
                uVar6 = uVar6 + 1;
              } while ((uint)nmemb != uVar6);
            }
            pvVar7 = (void *)((long)pvVar7 + 1);
            pvVar10 = (void *)((long)pvVar10 + (long)nmemb * 8);
          } while (pvVar7 != pvVar12);
        }
        info("Initialized FakeData\n");
      }
      else if (mode == 0) goto LAB_00103da0;
      info("Closing BigBlock\n");
      bf.basename = (char *)MPI_Wtime();
      big_block_mpi_close((BigBlock *)auStack_e8,(MPI_Comm)&ompi_mpi_comm_world);
      dVar17 = (double)MPI_Wtime();
      local_58 = (dVar17 - (double)bf.basename) + local_58;
      info("Closed BigBlock\n");
      info("Closing BigFile\n");
      bf.basename = (char *)MPI_Wtime();
      big_file_mpi_close(&stack0xffffffffffffffc0,(MPI_Comm)&ompi_mpi_comm_world);
      dVar17 = (double)MPI_Wtime();
      local_58 = (dVar17 - (double)bf.basename) + local_58;
      info("Closed BigFile\n");
      free(buf);
      pvVar12 = malloc((long)NTask * 0x28);
      MPI_Gather(&argv_local,0x28,&ompi_mpi_byte,pvVar12,0x28,&ompi_mpi_byte,0,&ompi_mpi_comm_world)
      ;
      if (ThisTask == 0) {
        sprintf(local_18f8,"%s/%s-timelog",local_8f8,MODES[mode]);
        __stream = fopen(local_18f8,"a+");
        if (__stream == (FILE *)0x0) {
          info("iosim.c: Couldn\'t open file %s for writting!\n",local_18f8);
        }
        else {
          fprintf(__stream,"# mode\tNfile\tranks\twriters\titems\tnmemb\n%s\t%d\t%d\t%d\t%td\t%d\n",
                  MODES[mode],(ulong)(uint)Nfile,(ulong)(uint)NTask,(ulong)(uint)Nwriter,size,
                  (ulong)(uint)nmemb);
          fwrite("# Task\tTcreate\t\tTopen\t\tTwrite\t\tTread\t\tTclose\n",0x2d,1,__stream);
          if (0 < NTask) {
            puVar14 = (undefined8 *)((long)pvVar12 + 0x20);
            lVar16 = 0;
            do {
              fprintf(__stream,"%04td\t%012.8f\t%012.8f\t%012.8f\t%012.8f\t%012.8f\n",puVar14[-4],
                      puVar14[-3],puVar14[-2],puVar14[-1],*puVar14,lVar16);
              lVar16 = lVar16 + 1;
              puVar14 = puVar14 + 5;
            } while (lVar16 < NTask);
          }
        }
        fclose(__stream);
      }
      free(pvVar12);
    }
    if ((purge != 0) && (ThisTask == 0)) {
      sprintf(local_18f8,"rm -rf %s/TestBlock",local_8f8);
      system(local_18f8);
    }
    goto LAB_001037e9;
  }
switchD_0010370b_caseD_6f:
  usage();
LAB_001037e9:
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
    MPI_Init(&argc, &argv);
    
    MPI_Comm_rank(MPI_COMM_WORLD, &ThisTask);
    MPI_Comm_size(MPI_COMM_WORLD, &NTask);
    
    int i;
    int ch;
    char * filename = alloca(1500);
    
    while(-1 != (ch = getopt(argc, argv, getoptstr))) {
        switch(ch) {
            case 'A':
                aggregated = 1;
                break;
            case 'p':
                purge = 1;
                break;
            case 'w':
                if(1 != sscanf(optarg, "%d", &nmemb)) {
                    usage();
                    goto byebye;
                }
                break;
            case 'f':
                if(1 != sscanf(optarg, "%d", &Nfile)) {
                    usage();
                    goto byebye;
                }
                break;
            case 'n':
                if(1 != sscanf(optarg, "%d", &Nwriter)) {
                    usage();
                    goto byebye;
                }
                break;
            case 's':
                if(1 != sscanf(optarg, "%td", &size)) {
                    usage();
                    goto byebye;
                }
                break;
            case 'h':
            default:
                usage();
                goto byebye;
        }    
    }
    if(optind == argc) {
        usage();
        goto byebye;
    }

    char * smode = strdup(argv[optind]);
    for(mode = 0; mode < 4; mode ++) {
        if(0 == strcmp(MODES[mode], smode)) break;
    }
    if(mode == 4) {
        usage(); goto byebye;
    }

    optind++;

    sprintf(filename, "%s", argv[optind]);

    if (Nwriter > NTask || Nwriter == 0) {
        info("############## CAUTION: you chose %d ranks and %d writers! ##############\n"
             " #  If you want %d writers, allocate at least %d ranks with <mpirun -n %d> #\n"
             " ################### Can only use %d writers instead! ###################\n",
             NTask, Nwriter, Nwriter, Nwriter, Nwriter, NTask);
        Nwriter = NTask;
    }
    if (Nfile == 0) {
        Nfile = Nwriter;
    }

    iosim(filename);

    if (purge) {
        if(ThisTask == 0) {
            char buffer[1500];
            sprintf(buffer, "rm -rf %s/TestBlock", filename);
            system(buffer);
        }
    }
//+++++++++++++++++ Writing Time Log +++++++++++++++++
byebye:
    MPI_Finalize();
    return 0;
}